

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySet.cxx
# Opt level: O3

set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
* anon_unknown.dwarf_4e98fb::GetTargetDependsClosure
            (map<const_cmGeneratorTarget_*,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
             *targetDepends,cmGeneratorTarget *tgt)

{
  TargetType TVar1;
  cmGlobalGenerator *this;
  TargetDependSet *pTVar2;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *psVar3;
  _Base_ptr p_Var4;
  _Base_ptr *this_00;
  _Rb_tree_header *p_Var5;
  pair<std::_Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>,_bool>
  pVar6;
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  local_98;
  pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>
  local_68;
  
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl._0_8_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  local_68.first = tgt;
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::_Rb_tree(&local_68.second._M_t,&local_98);
  pVar6 = std::
          _Rb_tree<cmGeneratorTarget_const*,std::pair<cmGeneratorTarget_const*const,std::set<cmGeneratorTarget_const*,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>>,std::_Select1st<std::pair<cmGeneratorTarget_const*const,std::set<cmGeneratorTarget_const*,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>>>,std::less<cmGeneratorTarget_const*>,std::allocator<std::pair<cmGeneratorTarget_const*const,std::set<cmGeneratorTarget_const*,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>>>>
          ::
          _M_insert_unique<std::pair<cmGeneratorTarget_const*const,std::set<cmGeneratorTarget_const*,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>>>
                    ((_Rb_tree<cmGeneratorTarget_const*,std::pair<cmGeneratorTarget_const*const,std::set<cmGeneratorTarget_const*,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>>,std::_Select1st<std::pair<cmGeneratorTarget_const*const,std::set<cmGeneratorTarget_const*,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>>>,std::less<cmGeneratorTarget_const*>,std::allocator<std::pair<cmGeneratorTarget_const*const,std::set<cmGeneratorTarget_const*,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>>>>
                      *)targetDepends,&local_68);
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~_Rb_tree(&local_68.second._M_t);
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~_Rb_tree(&local_98);
  this_00 = &pVar6.first._M_node._M_node[1]._M_parent;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    this = cmGeneratorTarget::GetGlobalGenerator(tgt);
    pTVar2 = cmGlobalGenerator::GetTargetDirectDepends(this,tgt);
    p_Var4 = (pTVar2->
             super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
             _M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var5 = &(pTVar2->
              super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>)
              ._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var5) {
      do {
        if ((*(char *)((long)&p_Var4[1]._M_parent + 2) == '\0') &&
           (*(char *)&p_Var4[1]._M_parent == '\x01')) {
          TVar1 = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)(p_Var4 + 1));
          if ((TVar1 < OBJECT_LIBRARY) && (TVar1 != STATIC_LIBRARY)) {
            local_68.first = *(cmGeneratorTarget **)(p_Var4 + 1);
            std::
            _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
            ::_M_insert_unique<cmGeneratorTarget_const*>
                      ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                        *)this_00,&local_68.first);
          }
          psVar3 = GetTargetDependsClosure(targetDepends,*(cmGeneratorTarget **)(p_Var4 + 1));
          std::
          _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
          ::_M_insert_range_unique<std::_Rb_tree_const_iterator<cmGeneratorTarget_const*>>
                    ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                      *)this_00,(psVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                     (_Rb_tree_const_iterator<const_cmGeneratorTarget_*>)
                     &(psVar3->_M_t)._M_impl.super__Rb_tree_header);
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var5);
    }
  }
  return (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *)this_00;
}

Assistant:

const std::set<const cmGeneratorTarget*>& GetTargetDependsClosure(
  std::map<const cmGeneratorTarget*, std::set<const cmGeneratorTarget*>>&
    targetDepends,
  const cmGeneratorTarget* tgt)
{
  auto it = targetDepends.insert({ tgt, {} });
  auto& retval = it.first->second;
  if (it.second) {
    auto const& deps = tgt->GetGlobalGenerator()->GetTargetDirectDepends(tgt);
    for (auto const& dep : deps) {
      if (!dep.IsCross() && dep.IsLink()) {
        auto type = dep->GetType();
        if (type == cmStateEnums::EXECUTABLE ||
            type == cmStateEnums::SHARED_LIBRARY ||
            type == cmStateEnums::MODULE_LIBRARY) {
          retval.insert(dep);
        }
        auto const& depDeps = GetTargetDependsClosure(targetDepends, dep);
        retval.insert(depDeps.begin(), depDeps.end());
      }
    }
  }
  return retval;
}